

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O1

void opn2_setRawEventHook(OPN2_MIDIPlayer *device,OPN2_RawEventHook rawEventHook,void *userData)

{
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setRawEventHook(struct OPN2_MIDIPlayer *device, OPN2_RawEventHook rawEventHook, void *userData)
{
#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->m_sequencerInterface->onEvent = rawEventHook;
    play->m_sequencerInterface->onEvent_userData = userData;
#else
    ADL_UNUSED(device);
    ADL_UNUSED(rawEventHook);
    ADL_UNUSED(userData);
#endif
}